

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammarResolver.cpp
# Opt level: O2

DatatypeValidator * __thiscall
xercesc_4_0::GrammarResolver::getDatatypeValidator
          (GrammarResolver *this,XMLCh *uriStr,XMLCh *localPartStr)

{
  bool bVar1;
  int iVar2;
  DatatypeValidatorFactory *this_00;
  DatatypeValidator *pDVar3;
  Grammar *pGVar4;
  undefined4 extraout_var;
  XMLBuffer nameBuf;
  
  bVar1 = XMLString::equals(uriStr,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  if (bVar1) {
    this_00 = this->fDataTypeReg;
    if (this_00 == (DatatypeValidatorFactory *)0x0) {
      this_00 = (DatatypeValidatorFactory *)XMemory::operator_new(0x18,this->fMemoryManager);
      DatatypeValidatorFactory::DatatypeValidatorFactory(this_00,this->fMemoryManager);
      this->fDataTypeReg = this_00;
    }
    pDVar3 = DatatypeValidatorFactory::getDatatypeValidator(this_00,localPartStr);
    return pDVar3;
  }
  pGVar4 = getGrammar(this,uriStr);
  if ((pGVar4 != (Grammar *)0x0) &&
     (iVar2 = (*(pGVar4->super_XSerializable)._vptr_XSerializable[5])(pGVar4), iVar2 == 1)) {
    nameBuf.fMemoryManager = this->fMemoryManager;
    nameBuf.fIndex = 0;
    nameBuf.fCapacity = 0x80;
    nameBuf.fFullSize = 0;
    nameBuf.fUsed = false;
    nameBuf.fFullHandler = (XMLBufferFullHandler *)0x0;
    iVar2 = (*(nameBuf.fMemoryManager)->_vptr_MemoryManager[3])(nameBuf.fMemoryManager,0x102);
    nameBuf.fBuffer = (XMLCh *)CONCAT44(extraout_var,iVar2);
    *nameBuf.fBuffer = L'\0';
    XMLBuffer::set(&nameBuf,uriStr);
    XMLBuffer::append(&nameBuf,L',');
    XMLBuffer::append(&nameBuf,localPartStr);
    nameBuf.fBuffer[nameBuf.fIndex] = L'\0';
    pDVar3 = DatatypeValidatorFactory::getDatatypeValidator
                       ((DatatypeValidatorFactory *)(pGVar4 + 0xf),nameBuf.fBuffer);
    XMLBuffer::~XMLBuffer(&nameBuf);
    return pDVar3;
  }
  return (DatatypeValidator *)0x0;
}

Assistant:

DatatypeValidator*
GrammarResolver::getDatatypeValidator(const XMLCh* const uriStr,
                                      const XMLCh* const localPartStr) {

    DatatypeValidator* dv = 0;

    if (XMLString::equals(uriStr, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)) {

        if (!fDataTypeReg) {

            fDataTypeReg = new (fMemoryManager) DatatypeValidatorFactory(fMemoryManager);
        }

        dv = fDataTypeReg->getDatatypeValidator(localPartStr);
    }
    else {

        Grammar* grammar = getGrammar(uriStr);

        if (grammar && grammar->getGrammarType() == Grammar::SchemaGrammarType) {

            XMLBuffer nameBuf(128, fMemoryManager);

            nameBuf.set(uriStr);
            nameBuf.append(chComma);
            nameBuf.append(localPartStr);

            dv = ((SchemaGrammar*) grammar)->getDatatypeRegistry()->getDatatypeValidator(nameBuf.getRawBuffer());
        }
    }

    return dv;
}